

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoapySDRProbe.cpp
# Opt level: O1

string * channelSensorReadings_abi_cxx11_
                   (string *__return_storage_ptr__,Device *device,int dir,size_t chan)

{
  long lVar1;
  char cVar2;
  string *psVar3;
  size_t sVar4;
  ostream *poVar5;
  long lVar6;
  ulong uVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sensors;
  string reading;
  string key;
  ArgInfo info;
  stringstream ss;
  string local_340;
  long local_320;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  string *local_300;
  size_t local_2f8;
  ulong local_2f0;
  char *local_2e8;
  long local_2e0;
  char local_2d8 [16];
  undefined1 *local_2c8 [2];
  undefined1 local_2b8 [16];
  undefined1 *local_2a8 [2];
  undefined1 local_298 [16];
  undefined1 *local_288;
  undefined1 local_278 [16];
  char *local_268;
  long local_260;
  char local_258 [16];
  char *local_248;
  long local_240;
  char local_238 [16];
  char *local_228;
  long local_220;
  char local_218 [24];
  Range local_200 [8];
  double local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_300 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_2f8 = chan;
  (**(code **)(*(long *)device + 0x2d0))(&local_318,device,dir);
  if (local_318.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_318.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar6 = 8;
    uVar7 = 0;
    do {
      local_2c8[0] = local_2b8;
      lVar1 = *(long *)((long)local_318.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar6 + -8);
      local_320 = lVar6;
      local_2f0 = uVar7;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2c8,lVar1,
                 *(long *)((long)&((local_318.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar6) + lVar1);
      sVar4 = local_2f8;
      (**(code **)(*(long *)device + 0x2d8))(local_2a8,device,dir,local_2f8,(string *)local_2c8);
      (**(code **)(*(long *)device + 0x2e0))(&local_2e8,device,dir,sVar4,(string *)local_2c8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"     * ",7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 *(char **)((long)local_318.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_320 + -8),
                 *(long *)((long)&((local_318.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          local_320));
      if (local_260 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," (",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_268,local_260);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      if (2.2250738585072014e-308 < local_1f8) {
        toString_abi_cxx11_(&local_340,local_200);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_340._M_dataplus._M_p,local_340._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != &local_340.field_2) {
          operator_delete(local_340._M_dataplus._M_p);
        }
      }
      toString<std::__cxx11::string>(&local_340,&local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_340._M_dataplus._M_p,local_340._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_2e8,local_2e0);
      if (local_220 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_228,local_220)
        ;
      }
      cVar2 = (char)(ostream *)local_1a8;
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      if (local_240 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"        ",8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_248,local_240);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      if (local_2e8 != local_2d8) {
        operator_delete(local_2e8);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1d0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1e8);
      if (local_228 != local_218) {
        operator_delete(local_228);
      }
      if (local_248 != local_238) {
        operator_delete(local_248);
      }
      if (local_268 != local_258) {
        operator_delete(local_268);
      }
      if (local_288 != local_278) {
        operator_delete(local_288);
      }
      if (local_2a8[0] != local_298) {
        operator_delete(local_2a8[0]);
      }
      uVar7 = local_2f0;
      if (local_2c8[0] != local_2b8) {
        operator_delete(local_2c8[0]);
      }
      uVar7 = uVar7 + 1;
      lVar6 = local_320 + 0x20;
    } while (uVar7 < (ulong)((long)local_318.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_318.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  psVar3 = local_300;
  std::__cxx11::stringbuf::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string channelSensorReadings(SoapySDR::Device *device, const int dir, const size_t chan)
{
    std::stringstream ss;

    /*******************************************************************
     * Channel sensor readings
     ******************************************************************/
    std::vector<std::string> sensors = device->listSensors(dir, chan);

    for (size_t i = 0; i < sensors.size(); i++)
    {
        std::string key = sensors[i];
        SoapySDR::ArgInfo info = device->getSensorInfo(dir, chan, key);
        std::string reading = device->readSensor(dir, chan, key);

        ss << "     * " << sensors[i];
        if (not info.name.empty()) ss << " (" << info.name << ")";
        ss << ":";
        if (info.range.maximum() > std::numeric_limits<double>::min()) ss << toString(info.range);
        ss << toString(info.options);
        ss << " " << reading;
        if (not info.units.empty()) ss << " " << info.units;
        ss << std::endl;
        if (not info.description.empty()) ss << "        " << info.description << std::endl;
    }

    return ss.str();
}